

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3423::ComputeNF
          (ChElementShellANCF_3423 *this,double U,double V,double W,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 in_register_00001208 [56];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  VectorN G_C;
  ChMatrix33<double> J_Cxi;
  Map<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0,_Eigen::Stride<0,_0>_> QiCompact;
  VectorN G_B;
  VectorN G_A;
  ChMatrix33<double> J_Cxi_Inv;
  MatrixNx3 e_bar;
  MatrixNx3 Sxi_D;
  double local_4c0 [4];
  double local_4a0;
  double local_498;
  double local_490;
  double local_488;
  double local_480;
  undefined8 uStack_478;
  undefined1 local_470 [16];
  undefined1 local_458 [24];
  double local_440;
  double local_438;
  double dStack_430;
  double local_428;
  double local_420;
  double dStack_418;
  double *local_410 [2];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  double local_380 [8];
  double local_340 [4];
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  SrcXprType local_300;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  DenseStorage<double,_8,_1,_8,_1> local_2c0;
  Matrix<double,_3,_3,_1,_3,_3> local_248;
  assign_op<double,_double> local_200 [192];
  Product<Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
  local_140;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  
  auVar27._8_56_ = in_register_00001208;
  auVar27._0_8_ = U;
  auVar37._8_8_ = 0x3fd0000000000000;
  auVar37._0_8_ = 0x3fd0000000000000;
  auVar37._16_8_ = 0x3fd0000000000000;
  auVar37._24_8_ = 0x3fd0000000000000;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = W * this->m_thickness * 0.5;
  auVar15 = vunpcklpd_avx(auVar27._0_16_,auVar15);
  local_480 = U + 1.0;
  local_470 = vsubpd_avx(ZEXT816(0x3ff0000000000000),auVar15);
  auVar31 = ZEXT1664(CONCAT88(V + 1.0,V + 1.0));
  uStack_478 = 0;
  auVar26._8_8_ = local_480;
  auVar26._0_8_ = local_480;
  auVar26._16_8_ = local_480;
  auVar26._24_8_ = local_480;
  auVar34 = ZEXT1632(CONCAT88(auVar15._8_8_ * 0.25,local_470._0_8_));
  auVar26 = vblendpd_avx(auVar34,auVar26,0xc);
  auVar34 = vpermpd_avx2(auVar34,0x60);
  auVar34 = vunpckhpd_avx(auVar37,auVar34);
  auVar27 = ZEXT3264(CONCAT824(auVar26._24_8_ * auVar34._24_8_,
                               CONCAT816(auVar26._16_8_ * auVar34._16_8_,
                                         CONCAT88(auVar26._8_8_ * auVar34._8_8_,
                                                  auVar26._0_8_ * auVar34._0_8_))));
  local_3c0 = vshuff64x2_avx512f(auVar27,auVar27,0x14);
  auVar27 = vpermt2pd_avx512f(_DAT_009ab100,auVar31);
  local_380 = (double  [8])vmulpd_avx512f(local_3c0,auVar27);
  local_410[0] = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
  uVar4 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_2c0.m_data.array = (plain_array<double,_8,_1,_64>)(plain_array<double,_8,_1,_64>)local_380;
  if (2 < (long)uVar4) {
    local_400 = vpermt2pd_avx512f(_DAT_009ab100,auVar31);
    local_140.m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
    m_data = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_140.m_lhs.m_matrix = (non_const_type)&local_2c0;
    local_140.m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
    m_rows.m_value = 3;
    local_140.m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    m_startRow.m_value = 0;
    local_140.m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr =
         F;
    local_140.m_rhs.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    m_outerStride = uVar4;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,8,3,1,8,3>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>,Eigen::internal::assign_op<double,double>>
              ((Map<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0,_Eigen::Stride<0,_0>_> *)local_410,
               &local_140,local_200,(type)0x0);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = this->m_lenX;
    auVar27 = vbroadcastsd_avx512f(auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = this->m_thickness;
    auVar31 = vbroadcastsd_avx512f(auVar17);
    auVar39._8_8_ = 0x3fd0000000000000;
    auVar39._0_8_ = 0x3fd0000000000000;
    auVar34._16_8_ = 0x3fd0000000000000;
    auVar34._0_16_ = auVar39;
    auVar34._24_8_ = 0x3fd0000000000000;
    dVar7 = auVar31._0_8_ * W * 0.5 * 0.25;
    auVar15 = vdivpd_avx(_DAT_009aa830,auVar27._0_16_);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar7;
    auVar16 = vunpcklpd_avx(auVar39,auVar19);
    auVar26 = vblendpd_avx(auVar34,ZEXT1632(auVar16),3);
    auVar26 = vpermpd_avx2(auVar26,100);
    auVar34 = vpermpd_avx2(ZEXT1632(auVar15),0x50);
    auVar38 = ZEXT3264(CONCAT824(auVar34._24_8_ * auVar26._24_8_,
                                 CONCAT816(auVar34._16_8_ * auVar26._16_8_,
                                           CONCAT88(auVar34._8_8_ * auVar26._8_8_,
                                                    auVar34._0_8_ * auVar26._0_8_))));
    auVar18._8_8_ = 0;
    auVar18._0_8_ = this->m_lenY;
    auVar22 = vbroadcastsd_avx512f(auVar18);
    auVar38 = vshuff64x2_avx512f(auVar38,auVar38,0x14);
    auVar38 = vmulpd_avx512f(auVar38,local_400);
    auVar15 = vdivpd_avx(_DAT_009aa830,auVar22._0_16_);
    auVar27 = vmulpd_avx512f(auVar27,auVar38);
    auVar38 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
    auVar23 = vpermpd_avx512f(_DAT_009ab140,ZEXT1664(auVar15));
    auVar27 = vmulpd_avx512f(auVar27,auVar38);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar7 * (double)local_470._0_8_;
    auVar15 = vunpcklpd_avx(local_3c0._0_16_,auVar41);
    auVar24 = vinsertf32x4_avx512f(local_3c0,auVar15,0);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar7 * local_480;
    auVar25 = vbroadcastsd_avx512f(auVar21);
    auVar44._0_24_ = auVar24._0_24_;
    auVar44._24_8_ = auVar25._24_8_;
    auVar44._32_8_ = auVar24._32_8_;
    auVar44._40_8_ = auVar24._40_8_;
    auVar44._48_8_ = auVar24._48_8_;
    auVar44._56_8_ = auVar24._56_8_;
    auVar24 = vshuff64x2_avx512f(auVar44,auVar44,0x14);
    auVar44 = ZEXT3264(_DAT_009aa780);
    auVar23 = vmulpd_avx512f(auVar24,auVar23);
    auVar24 = vunpcklpd_avx512f(ZEXT864(0) << 0x40,(undefined1  [64])local_380);
    auVar22 = vmulpd_avx512f(auVar22,auVar23);
    auVar22 = vmulpd_avx512f(auVar22,auVar38);
    vscatterdpd_avx512f(ZEXT864(&local_140) + auVar44,0xffff,auVar27);
    auVar27 = vmulpd_avx512f(auVar31,auVar24);
    vscatterdpd_avx512f(ZEXT864(&local_140) + ZEXT864(8) + auVar44,0xffff,auVar22);
    auVar27 = vmulpd_avx512f(auVar27,auVar38);
    vscatterdpd_avx512f(ZEXT864(&local_140) + ZEXT864(0x10) + auVar44,0xffff,auVar27);
    CalcCoordMatrix(this,(ChMatrixNM<double,_8,_3> *)local_200);
    local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = (double)local_200;
    local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
         = (double)&local_140;
    Eigen::internal::
    generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Matrix<double,8,3,1,8,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>
              ((Matrix<double,_3,_3,_1,_3,_3> *)local_458,
               (Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_> *)&local_248,
               (Matrix<double,_8,_3,_1,_8,_3> *)&local_140);
    local_300.m_xpr = (Matrix<double,_3,_3,_1,_3,_3> *)local_458;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_248,&local_300,(assign_op<double,_double> *)local_340);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_140.m_lhs.m_matrix;
    auVar28._8_8_ = 0;
    auVar28._0_8_ =
         local_140.m_rhs.m_matrix.
         super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
         m_data;
    auVar72._8_8_ = 0;
    auVar72._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar15 = vmulsd_avx512f(auVar72,auVar20);
    auVar77._8_8_ = 0;
    auVar77._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar16 = vmulsd_avx512f(auVar77,auVar28);
    auVar95._8_8_ = 0;
    auVar95._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar17 = vmulsd_avx512f(auVar20,auVar95);
    auVar32._8_8_ = 0;
    auVar32._0_8_ =
         local_140.m_rhs.m_matrix.
         super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
         m_rows.m_value;
    auVar80._8_8_ = 0;
    auVar80._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar18 = vmulsd_avx512f(auVar80,auVar32);
    auVar36._8_8_ = 0;
    auVar36._0_8_ =
         local_140.m_rhs.m_matrix.
         super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
         m_xpr;
    local_300.m_xpr = (XprTypeNested)(auVar15._0_8_ + auVar16._0_8_ + auVar18._0_8_);
    auVar35._8_8_ = 0;
    auVar35._0_8_ =
         local_140.m_rhs.m_matrix.
         super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
         _16_8_;
    auVar15 = vmulsd_avx512f(auVar77,auVar36);
    auVar16 = vmulsd_avx512f(auVar72,auVar35);
    auVar40._8_8_ = 0;
    auVar40._0_8_ =
         local_140.m_rhs.m_matrix.
         super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
         m_startRow.m_value;
    auVar18 = vmulsd_avx512f(auVar80,auVar40);
    auVar45._8_8_ = 0;
    auVar45._0_8_ =
         local_140.m_rhs.m_matrix.
         super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
         m_outerStride;
    local_2f8 = auVar16._0_8_ + auVar15._0_8_ + auVar18._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ =
         local_140.m_rhs.m_matrix.
         super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
         _40_8_;
    auVar78._8_8_ = 0;
    auVar78._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar15 = vmulsd_avx512f(auVar78,auVar45);
    auVar73._8_8_ = 0;
    auVar73._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar16 = vmulsd_avx512f(auVar73,auVar42);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_100;
    auVar81._8_8_ = 0;
    auVar81._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar18 = vmulsd_avx512f(auVar81,auVar49);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_f0;
    local_2f0 = auVar16._0_8_ + auVar15._0_8_ + auVar18._0_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_f8;
    auVar15 = vmulsd_avx512f(auVar78,auVar53);
    auVar16 = vmulsd_avx512f(auVar73,auVar52);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_e8;
    auVar18 = vmulsd_avx512f(auVar81,auVar54);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_d8;
    local_2e8 = auVar16._0_8_ + auVar15._0_8_ + auVar18._0_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_e0;
    auVar15 = vmulsd_avx512f(auVar78,auVar56);
    auVar16 = vmulsd_avx512f(auVar73,auVar55);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_d0;
    auVar18 = vmulsd_avx512f(auVar81,auVar57);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = auVar16._0_8_ + auVar15._0_8_;
    auVar15 = vaddsd_avx512f(auVar58,auVar18);
    local_2e0 = auVar15._0_8_;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_c8;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_c0;
    auVar15 = vmulsd_avx512f(auVar78,auVar60);
    auVar16 = vmulsd_avx512f(auVar73,auVar59);
    auVar15 = vaddsd_avx512f(auVar16,auVar15);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_b8;
    auVar16 = vmulsd_avx512f(auVar81,auVar62);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    vmovsd_avx512f(auVar15);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_a8;
    auVar79._8_8_ = 0;
    auVar79._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar15 = vmulsd_avx512f(auVar79,auVar66);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_b0;
    auVar74._8_8_ = 0;
    auVar74._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar16 = vmulsd_avx512f(auVar74,auVar64);
    auVar15 = vaddsd_avx512f(auVar16,auVar15);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = local_a0;
    auVar82._8_8_ = 0;
    auVar82._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar16 = vmulsd_avx512f(auVar82,auVar68);
    auVar101._8_8_ = 0;
    auVar101._0_8_ = local_88;
    auVar18 = vmulsd_avx512f(auVar82,auVar101);
    auVar89._8_8_ = 0;
    auVar89._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar19 = vmulsd_avx512f(auVar68,auVar89);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    vmovsd_avx512f(auVar15);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_98;
    auVar15 = vmulsd_avx512f(auVar74,auVar70);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_90;
    auVar16 = vmulsd_avx512f(auVar79,auVar75);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    auVar15 = vaddsd_avx512f(auVar15,auVar18);
    vmovsd_avx512f(auVar15);
    auVar86._8_8_ = 0;
    auVar86._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar15 = vmulsd_avx512f(auVar28,auVar86);
    auVar15 = vaddsd_avx512f(auVar17,auVar15);
    auVar16 = vmulsd_avx512f(auVar32,auVar89);
    auVar83._8_8_ = 0;
    auVar83._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar17 = vmulsd_avx512f(auVar20,auVar83);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    auVar16 = vmulsd_avx512f(auVar36,auVar86);
    vmovsd_avx512f(auVar15);
    auVar15 = vmulsd_avx512f(auVar35,auVar95);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    auVar90._8_8_ = 0;
    auVar90._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar16 = vmulsd_avx512f(auVar40,auVar90);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    auVar87._8_8_ = 0;
    auVar87._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar16 = vmulsd_avx512f(auVar45,auVar87);
    vmovsd_avx512f(auVar15);
    auVar96._8_8_ = 0;
    auVar96._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar15 = vmulsd_avx512f(auVar42,auVar96);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    auVar16 = vmulsd_avx512f(auVar49,auVar90);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    auVar16 = vmulsd_avx512f(auVar53,auVar87);
    vmovsd_avx512f(auVar15);
    auVar15 = vmulsd_avx512f(auVar52,auVar96);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    auVar16 = vmulsd_avx512f(auVar54,auVar90);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    auVar16 = vmulsd_avx512f(auVar56,auVar87);
    vmovsd_avx512f(auVar15);
    auVar15 = vmulsd_avx512f(auVar55,auVar96);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    auVar16 = vmulsd_avx512f(auVar57,auVar90);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    auVar16 = vmulsd_avx512f(auVar60,auVar87);
    vmovsd_avx512f(auVar15);
    auVar15 = vmulsd_avx512f(auVar59,auVar96);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    auVar91._8_8_ = 0;
    auVar91._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar16 = vmulsd_avx512f(auVar62,auVar91);
    auVar18 = vmulsd_avx512f(auVar101,auVar91);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    auVar88._8_8_ = 0;
    auVar88._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar16 = vmulsd_avx512f(auVar66,auVar88);
    auVar20 = vmulsd_avx512f(auVar75,auVar88);
    vmovsd_avx512f(auVar15);
    auVar97._8_8_ = 0;
    auVar97._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar15 = vmulsd_avx512f(auVar64,auVar97);
    auVar21 = vmulsd_avx512f(auVar70,auVar97);
    auVar20 = vaddsd_avx512f(auVar21,auVar20);
    auVar15 = vaddsd_avx512f(auVar15,auVar16);
    auVar16 = vaddsd_avx512f(auVar20,auVar18);
    auVar15 = vaddsd_avx512f(auVar15,auVar19);
    vmovsd_avx512f(auVar15);
    vmovsd_avx512f(auVar16);
    auVar98._8_8_ = 0;
    auVar98._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar15 = vmulsd_avx512f(auVar28,auVar98);
    auVar92._8_8_ = 0;
    auVar92._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar16 = vmulsd_avx512f(auVar32,auVar92);
    auVar102._8_8_ = 0;
    auVar102._0_8_ = local_88;
    auVar18 = vmulsd_avx512f(auVar102,auVar92);
    auVar19 = vmulsd_avx512f(auVar36,auVar98);
    local_4c0[0] = auVar17._0_8_ + auVar15._0_8_ + auVar16._0_8_;
    auVar15 = vmulsd_avx512f(auVar35,auVar83);
    auVar93._8_8_ = 0;
    auVar93._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar16 = vmulsd_avx512f(auVar40,auVar93);
    auVar99._8_8_ = 0;
    auVar99._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar17 = vmulsd_avx512f(auVar45,auVar99);
    local_4c0[1] = auVar15._0_8_ + auVar19._0_8_ + auVar16._0_8_;
    auVar84._8_8_ = 0;
    auVar84._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar15 = vmulsd_avx512f(auVar42,auVar84);
    auVar16 = vmulsd_avx512f(auVar49,auVar93);
    auVar19 = vmulsd_avx512f(auVar53,auVar99);
    local_4c0[2] = auVar15._0_8_ + auVar17._0_8_ + auVar16._0_8_;
    auVar15 = vmulsd_avx512f(auVar52,auVar84);
    auVar16 = vmulsd_avx512f(auVar54,auVar93);
    auVar17 = vmulsd_avx512f(auVar56,auVar99);
    local_4c0[3] = auVar15._0_8_ + auVar19._0_8_ + auVar16._0_8_;
    auVar15 = vmulsd_avx512f(auVar55,auVar84);
    auVar16 = vmulsd_avx512f(auVar57,auVar93);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_c0;
    auVar19 = vmulsd_avx512f(auVar61,auVar99);
    local_4a0 = auVar15._0_8_ + auVar17._0_8_ + auVar16._0_8_;
    auVar15 = vmulsd_avx512f(auVar59,auVar84);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_b8;
    auVar94._8_8_ = 0;
    auVar94._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar16 = vmulsd_avx512f(auVar63,auVar94);
    auVar67._8_8_ = 0;
    auVar67._0_8_ = local_a8;
    auVar100._8_8_ = 0;
    auVar100._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar17 = vmulsd_avx512f(auVar67,auVar100);
    local_498 = auVar15._0_8_ + auVar19._0_8_ + auVar16._0_8_;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_b0;
    auVar85._8_8_ = 0;
    auVar85._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar15 = vmulsd_avx512f(auVar65,auVar85);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_a0;
    auVar16 = vmulsd_avx512f(auVar69,auVar94);
    auVar76._8_8_ = 0;
    auVar76._0_8_ = local_90;
    auVar19 = vmulsd_avx512f(auVar76,auVar100);
    local_490 = auVar15._0_8_ + auVar17._0_8_ + auVar16._0_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_98;
    auVar15 = vmulsd_avx512f(auVar71,auVar85);
    local_488 = auVar15._0_8_ + auVar19._0_8_ + auVar18._0_8_;
    if (5 < (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar5 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      uVar13 = 2;
      lVar14 = 0;
      pdVar6 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar4 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      auVar8._8_8_ = 0x3fe0000000000000;
      auVar8._0_8_ = 0x3fe0000000000000;
      auVar16 = vmulpd_avx512vl(*(undefined1 (*) [16])(pdVar5 + 3),auVar8);
      dVar7 = pdVar5[5] * 0.5;
      auVar15 = vshufpd_avx(auVar16,auVar16,1);
      while ((long)(uVar13 - 2) < (long)uVar4) {
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(double *)((long)local_340 + lVar14);
        dVar1 = *(double *)((long)local_4c0 + lVar14);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = dVar1;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(double *)((long)local_340 + lVar14) * -dVar7;
        auVar17 = vfmadd231sd_fma(auVar50,auVar15,auVar46);
        pdVar6[uVar13 - 2] = auVar17._0_8_ + pdVar6[uVar13 - 2];
        if (uVar4 <= uVar13 - 1) break;
        dVar2 = *(double *)((long)&local_300.m_xpr + lVar14);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = dVar2;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar7;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = dVar1 * -auVar16._0_8_;
        auVar17 = vfmadd231sd_fma(auVar47,auVar29,auVar51);
        pdVar6[uVar13 - 1] = auVar17._0_8_ + pdVar6[uVar13 - 1];
        if (uVar4 <= uVar13) break;
        lVar14 = lVar14 + 8;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = dVar2 * -auVar15._0_8_;
        auVar17 = vfmadd213sd_fma(auVar43,auVar16,auVar48);
        pdVar6[uVar13] = auVar17._0_8_ + pdVar6[uVar13];
        uVar13 = uVar13 + 3;
        if (uVar13 == 0x1a) {
          auVar11._8_8_ = dStack_430;
          auVar11._0_8_ = local_438;
          auVar12._8_8_ = dStack_418;
          auVar12._0_8_ = local_420;
          auVar9._8_8_ = local_428;
          auVar9._0_8_ = local_428;
          auVar15 = vmulpd_avx512vl(auVar11,auVar9);
          auVar10._8_8_ = local_440;
          auVar10._0_8_ = local_440;
          auVar17 = vfmsub231pd_avx512vl(auVar15,auVar12,auVar10);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = dStack_418;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = local_420 * dStack_430;
          auVar16 = vfmsub132sd_fma(auVar11,auVar33,auVar3);
          auVar15 = vpermilpd_avx(local_458._8_16_,1);
          auVar30._0_8_ = auVar15._0_8_ * auVar17._0_8_;
          auVar30._8_8_ = auVar15._8_8_ * auVar17._8_8_;
          auVar15 = vshufpd_avx(auVar30,auVar30,1);
          *detJ = auVar30._0_8_ + (auVar16._0_8_ * (double)local_458._0_8_ - auVar15._0_8_);
          return;
        }
      }
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementShellANCF_3423::ComputeNF(
    const double U,              // parametric coordinate in volume
    const double V,              // parametric coordinate in volume
    const double W,              // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    ShapeVector N;
    ShapeFunctions(N, U, V, W);

    Eigen::Map<MatrixNx3> QiCompact(Qi.data(), NSF, 3);
    QiCompact = N.transpose() * F.segment(0, 3).transpose();

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.
    ShapeVector Nx;
    ShapeVector Ny;
    ShapeVector Nz;
    ShapeFunctionsDerivativeX(Nx, U, V, W);
    ShapeFunctionsDerivativeY(Ny, U, V, W);
    ShapeFunctionsDerivativeZ(Nz, U, V, W);

    // Change the shape function derivatives with respect to the element local "x", "y", or "z" coordinates to be with
    // respect to the normalized coordinates "xi", "eta", and "zeta" when loading the results into the Sxi_D matrix
    MatrixNx3 Sxi_D;
    Sxi_D.col(0) = Nx * m_lenX / 2;
    Sxi_D.col(1) = Ny * m_lenY / 2;
    Sxi_D.col(2) = Nz * m_thickness / 2;

    MatrixNx3 e_bar;
    CalcCoordMatrix(e_bar);

    // Calculate the element Jacobian between the current configuration and the normalized configuration
    ChMatrix33<double> J_Cxi = e_bar.transpose() * Sxi_D;
    ChMatrix33<double> J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i + 0) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi(3 * i + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi(3 * i + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential volume and the normalized differential volume.  The determinate of the element Jacobian is
    //  used to calculate this volume ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.determinant();
}